

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::buildPMT(TSMuxer *this)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  uint8_t *buffer;
  long lVar4;
  ulong uVar5;
  uint8_t *__src;
  long lVar6;
  long lVar7;
  
  this->m_pmtBuffer[0] = 'G';
  this->m_pmtBuffer[1] = 'A';
  this->m_pmtBuffer[2] = '\0';
  this->m_pmtBuffer[3] = '\x10';
  buffer = this->m_pmtBuffer + 4;
  uVar1 = TS_program_map_section::serialize
                    (&this->m_pmt,buffer,0xf18,this->m_bluRayMode,this->m_hdmvDescriptors);
  uVar5 = (ulong)uVar1;
  __src = this->m_pmtBuffer;
  lVar6 = -0xb8;
  lVar7 = -0xc0;
  lVar4 = 4;
  uVar2 = uVar5;
  while( true ) {
    __src = __src + 0xbc;
    uVar2 = uVar2 + 4;
    if (buffer + uVar5 <= __src) break;
    memmove(__src + 4,__src,uVar5 + lVar6);
    __src[0] = 'G';
    __src[1] = '\x01';
    __src[2] = '\0';
    __src[3] = '\x10';
    lVar6 = lVar6 + -0xb8;
    lVar7 = lVar7 + -4;
    lVar4 = lVar4 + 4;
    buffer = buffer + 4;
  }
  lVar3 = lVar4 + (uVar2 / 0xbc) * -0xbc + uVar5;
  lVar6 = (uVar5 - lVar7) - lVar3;
  if (lVar3 == 0) {
    lVar6 = uVar5 + lVar4;
  }
  memset(buffer + uVar5,0xff,(lVar6 - uVar5) - lVar4);
  this->m_pmtFrames = lVar6 / 0xbc;
  return;
}

Assistant:

void TSMuxer::buildPMT()
{
    *reinterpret_cast<uint32_t*>(m_pmtBuffer) = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
    const auto tsPacket = reinterpret_cast<TSPacket*>(m_pmtBuffer);
    tsPacket->setPID(DEFAULT_PMT_PID);
    tsPacket->dataExists = 1;
    tsPacket->payloadStart = 1;
    const uint32_t size =
        m_pmt.serialize(m_pmtBuffer + TSPacket::TS_HEADER_SIZE, 3864, m_bluRayMode, m_hdmvDescriptors);
    uint8_t* pmtEnd = m_pmtBuffer + TSPacket::TS_HEADER_SIZE + size;
    uint8_t* curPos = m_pmtBuffer + TS_FRAME_SIZE;
    for (; curPos < pmtEnd; curPos += TS_FRAME_SIZE)
    {
        memmove(curPos + 4, curPos, pmtEnd - curPos);
        pmtEnd += 4;
        *reinterpret_cast<uint32_t*>(curPos) = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
        const auto tsPacket2 = reinterpret_cast<TSPacket*>(curPos);
        tsPacket2->setPID(DEFAULT_PMT_PID);
        tsPacket2->dataExists = 1;
        tsPacket2->payloadStart = 0;
    }
    const int64_t oldPmtSize = pmtEnd - m_pmtBuffer;
    int64_t roundSize = pmtEnd - m_pmtBuffer;
    if (roundSize % TS_FRAME_SIZE != 0)
        roundSize = (roundSize / TS_FRAME_SIZE + 1) * TS_FRAME_SIZE;
    memset(pmtEnd, 0xff, roundSize - oldPmtSize);
    m_pmtFrames = roundSize / TS_FRAME_SIZE;
}